

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::anon_unknown_0::BasicAllTargetsAtomic::AtomicMS<unsigned_int>
          (BasicAllTargetsAtomic *this,GLenum internalformat)

{
  bool bVar1;
  GLuint GVar2;
  GLint GVar3;
  char *src_fs;
  Vector<float,_4> local_ac;
  byte local_99;
  GLuint local_98;
  bool status;
  GLuint value_1 [4];
  GLint value [4];
  GLenum local_70 [2];
  GLenum draw_buffers [3];
  GLuint fbo;
  int kSize;
  GLuint textures [2];
  string local_48;
  GLuint local_24;
  char *pcStack_20;
  GLuint program;
  char *src_vs;
  BasicAllTargetsAtomic *pBStack_10;
  GLenum internalformat_local;
  BasicAllTargetsAtomic *this_local;
  
  pcStack_20 = 
  "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
  ;
  src_vs._4_4_ = internalformat;
  pBStack_10 = this;
  GenFSMS<unsigned_int>(&local_48,this,internalformat);
  src_fs = (char *)std::__cxx11::string::c_str();
  GVar2 = ShaderImageLoadStoreBase::BuildProgram
                    (&this->super_ShaderImageLoadStoreBase,
                     "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                     ,(char *)0x0,(char *)0x0,(char *)0x0,src_fs,(bool *)0x0);
  std::__cxx11::string::~string((string *)&local_48);
  local_24 = GVar2;
  glu::CallLogWrapper::glGenTextures
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,2,&fbo);
  draw_buffers[2] = 0x10;
  glu::CallLogWrapper::glBindTexture
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x9100,fbo);
  glu::CallLogWrapper::glTexImage2DMultisample
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x9100,4,src_vs._4_4_,0x10,0x10,'\0');
  glu::CallLogWrapper::glBindTexture
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x9100,0);
  glu::CallLogWrapper::glBindTexture
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x9102,kSize);
  glu::CallLogWrapper::glTexImage3DMultisample
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x9102,4,src_vs._4_4_,0x10,0x10,2,'\0');
  glu::CallLogWrapper::glBindTexture
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x9102,0);
  glu::CallLogWrapper::glGenFramebuffers
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,draw_buffers + 1);
  glu::CallLogWrapper::glBindFramebuffer
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8d40,draw_buffers[1]);
  glu::CallLogWrapper::glFramebufferTexture2D
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8d40,0x8ce0,0x9100,fbo,0);
  glu::CallLogWrapper::glFramebufferTextureLayer
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8d40,0x8ce1,kSize,0,0);
  glu::CallLogWrapper::glFramebufferTextureLayer
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8d40,0x8ce2,kSize,0,1);
  local_70[0] = 0x8ce0;
  local_70[1] = 0x8ce1;
  draw_buffers[0] = 0x8ce2;
  glu::CallLogWrapper::glDrawBuffers
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,3,local_70);
  if (src_vs._4_4_ == 0x8235) {
    memset(value_1 + 2,0,0x10);
    glu::CallLogWrapper::glClearBufferiv
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x1800,0,(GLint *)(value_1 + 2));
    glu::CallLogWrapper::glClearBufferiv
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x1800,1,(GLint *)(value_1 + 2));
    glu::CallLogWrapper::glClearBufferiv
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x1800,2,(GLint *)(value_1 + 2));
  }
  else {
    memset(&local_98,0,0x10);
    glu::CallLogWrapper::glClearBufferuiv
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x1800,0,&local_98);
    glu::CallLogWrapper::glClearBufferuiv
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x1800,1,&local_98);
    glu::CallLogWrapper::glClearBufferuiv
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x1800,2,&local_98);
  }
  glu::CallLogWrapper::glDeleteFramebuffers
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,draw_buffers + 1);
  glu::CallLogWrapper::glBindImageTexture
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,fbo,0,'\0',0,0x88ba,src_vs._4_4_);
  glu::CallLogWrapper::glBindImageTexture
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,4,kSize,0,'\x01',0,0x88ba,src_vs._4_4_);
  glu::CallLogWrapper::glUseProgram
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,local_24);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation
                    (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,local_24,"g_image_2dms");
  glu::CallLogWrapper::glUniform1i
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,GVar3,1);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation
                    (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,local_24,"g_image_2dms_array");
  glu::CallLogWrapper::glUniform1i
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,GVar3,4);
  glu::CallLogWrapper::glClear
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x4000);
  glu::CallLogWrapper::glBindVertexArray
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->m_vao);
  glu::CallLogWrapper::glViewport
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0,0,0x10,0x10);
  glu::CallLogWrapper::glDrawArrays
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,5,0,4);
  local_99 = 1;
  tcu::Vector<float,_4>::Vector(&local_ac,0.0,1.0,0.0,1.0);
  bVar1 = ShaderImageLoadStoreBase::ValidateReadBuffer
                    (&this->super_ShaderImageLoadStoreBase,0,0,0x10,0x10,&local_ac);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    local_99 = 0;
  }
  glu::CallLogWrapper::glDeleteTextures
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,2,&fbo);
  glu::CallLogWrapper::glUseProgram
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0);
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,local_24);
  return (bool)(local_99 & 1);
}

Assistant:

bool AtomicMS(GLenum internalformat)
	{
		const char* src_vs = "#version 420 core" NL "layout(location = 0) in vec4 i_position;" NL "void main() {" NL
							 "  gl_Position = i_position;" NL "}";
		const GLuint program = BuildProgram(src_vs, NULL, NULL, NULL, GenFSMS<T>(internalformat).c_str());
		GLuint		 textures[2];
		glGenTextures(2, textures);

		const int kSize = 16;

		glBindTexture(GL_TEXTURE_2D_MULTISAMPLE, textures[0]);
		glTexImage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, 4, internalformat, kSize, kSize, GL_FALSE);
		glBindTexture(GL_TEXTURE_2D_MULTISAMPLE, 0);

		glBindTexture(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, textures[1]);
		glTexImage3DMultisample(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, 4, internalformat, kSize, kSize, 2, GL_FALSE);
		glBindTexture(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, 0);

		GLuint fbo;
		glGenFramebuffers(1, &fbo);
		glBindFramebuffer(GL_FRAMEBUFFER, fbo);
		glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D_MULTISAMPLE, textures[0], 0);
		glFramebufferTextureLayer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT1, textures[1], 0, 0);
		glFramebufferTextureLayer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT2, textures[1], 0, 1);
		const GLenum draw_buffers[3] = { GL_COLOR_ATTACHMENT0, GL_COLOR_ATTACHMENT1, GL_COLOR_ATTACHMENT2 };
		glDrawBuffers(3, draw_buffers);
		if (internalformat == GL_R32I)
		{
			const GLint value[4] = { 0, 0, 0, 0 };
			glClearBufferiv(GL_COLOR, 0, value);
			glClearBufferiv(GL_COLOR, 1, value);
			glClearBufferiv(GL_COLOR, 2, value);
		}
		else
		{
			const GLuint value[4] = { 0, 0, 0, 0 };
			glClearBufferuiv(GL_COLOR, 0, value);
			glClearBufferuiv(GL_COLOR, 1, value);
			glClearBufferuiv(GL_COLOR, 2, value);
		}
		glDeleteFramebuffers(1, &fbo);

		glBindImageTexture(1, textures[0], 0, GL_FALSE, 0, GL_READ_WRITE, internalformat);
		glBindImageTexture(4, textures[1], 0, GL_TRUE, 0, GL_READ_WRITE, internalformat);

		glUseProgram(program);
		glUniform1i(glGetUniformLocation(program, "g_image_2dms"), 1);
		glUniform1i(glGetUniformLocation(program, "g_image_2dms_array"), 4);

		glClear(GL_COLOR_BUFFER_BIT);
		glBindVertexArray(m_vao);
		glViewport(0, 0, kSize, kSize);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

		bool status = true;

		if (!ValidateReadBuffer(0, 0, kSize, kSize, vec4(0, 1, 0, 1)))
		{
			status = false;
		}

		glDeleteTextures(2, textures);
		glUseProgram(0);
		glDeleteProgram(program);

		return status;
	}